

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record.hpp
# Opt level: O0

void __thiscall Excel::Record::~Record(Record *this)

{
  RecordSubstream *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  
  std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  RecordSubstream::~RecordSubstream(in_RDI);
  return;
}

Assistant:

inline
Record::~Record()
{
}